

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void push_heap_suite::push_sequence(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  undefined1 local_3d4 [8];
  array<int,_15UL> expect_14;
  array<int,_15UL> expect_13;
  array<int,_15UL> expect_12;
  array<int,_15UL> expect_11;
  array<int,_15UL> expect_10;
  array<int,_15UL> expect_9;
  array<int,_15UL> expect_8;
  array<int,_15UL> expect_7;
  array<int,_15UL> expect_6;
  array<int,_15UL> expect_5;
  array<int,_15UL> expect_4;
  array<int,_15UL> expect_3;
  array<int,_15UL> expect_2;
  array<int,_15UL> expect_1;
  array<int,_15UL> expect;
  iterator last;
  array<int,_15UL> heap;
  
  memset((void *)((long)&last + 4),0,0x3c);
  pvVar1 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  *pvVar1 = 8;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 1);
  memset(expect_1._M_elems + 0xd,0,0x3c);
  expect_1._M_elems[0xd] = 8;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_1._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_1._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x113,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[1] = 3;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 2);
  memset(expect_2._M_elems + 0xd,0,0x3c);
  expect_2._M_elems[0xd] = 8;
  expect_2._M_elems[0xe] = 3;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_2._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_2._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x11a,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[2] = 6;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 3);
  memset(expect_3._M_elems + 0xd,0,0x3c);
  expect_3._M_elems[0xd] = 8;
  expect_3._M_elems[0xe] = 3;
  expect_2._M_elems[0] = 6;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_3._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_3._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x121,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[3] = 9;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 4);
  memset(expect_4._M_elems + 0xd,0,0x3c);
  expect_4._M_elems[0xd] = 9;
  expect_4._M_elems[0xe] = 8;
  expect_3._M_elems[0] = 6;
  expect_3._M_elems[1] = 3;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_4._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_4._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x128,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[4] = 5;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 5);
  memset(expect_5._M_elems + 0xd,0,0x3c);
  expect_5._M_elems[0xd] = 9;
  expect_5._M_elems[0xe] = 8;
  expect_4._M_elems[0] = 6;
  expect_4._M_elems[1] = 3;
  expect_4._M_elems[2] = 5;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_5._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_5._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x12f,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[5] = 2;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 6);
  memset(expect_6._M_elems + 0xd,0,0x3c);
  expect_6._M_elems[0xd] = 9;
  expect_6._M_elems[0xe] = 8;
  expect_5._M_elems[0] = 6;
  expect_5._M_elems[1] = 3;
  expect_5._M_elems[2] = 5;
  expect_5._M_elems[3] = 2;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_6._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_6._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x136,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[6] = 0xf;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 7);
  memcpy(expect_7._M_elems + 0xd,&DAT_0010cfa4,0x3c);
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_7._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_7._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x13d,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[7] = 1;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 8);
  memcpy(expect_8._M_elems + 0xd,&DAT_0010cfe0,0x3c);
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_8._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_8._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x144,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[8] = 4;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 9);
  memcpy(expect_9._M_elems + 0xd,&DAT_0010d01c,0x3c);
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_9._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_9._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x14b,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[9] = 0xc;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 10);
  memcpy(expect_10._M_elems + 0xd,&DAT_0010d058,0x3c);
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_10._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_10._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x152,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[10] = 7;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 0xb);
  memcpy(expect_11._M_elems + 0xd,&DAT_0010d094,0x3c);
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_11._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_11._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x159,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[0xb] = 10;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 0xc);
  memcpy(expect_12._M_elems + 0xd,&DAT_0010d0d0,0x3c);
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_12._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_12._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x160,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[0xc] = 0xd;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 0xd);
  memcpy(expect_13._M_elems + 0xd,&DAT_0010d10c,0x3c);
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_13._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_13._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x167,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[0xd] = 0xb;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 0xe);
  memcpy(expect_14._M_elems + 0xd,&DAT_0010d148,0x3c);
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar4 = std::array<int,_15UL>::begin((array<int,_15UL> *)(expect_14._M_elems + 0xd));
  pvVar5 = std::array<int,_15UL>::end((array<int,_15UL> *)(expect_14._M_elems + 0xd));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x16e,"void push_heap_suite::push_sequence()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar1[0xe] = 0xe;
  pvVar2 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  vista::push_heap<int*>(pvVar2,pvVar1 + 0xf);
  memcpy(local_3d4,&DAT_0010d184,0x3c);
  pvVar1 = std::array<int,_15UL>::begin((array<int,_15UL> *)((long)&last + 4));
  pvVar2 = std::array<int,_15UL>::end((array<int,_15UL> *)((long)&last + 4));
  pvVar3 = std::array<int,_15UL>::begin((array<int,_15UL> *)local_3d4);
  pvVar4 = std::array<int,_15UL>::end((array<int,_15UL> *)local_3d4);
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x175,"void push_heap_suite::push_sequence()",pvVar1,pvVar2,pvVar3,pvVar4);
  return;
}

Assistant:

void push_sequence()
{
    // 8 3 6 9 5 2 15 1 4 12 7 10 13 11 14

    std::array<int, 15> heap = {};
    auto last = heap.begin();
    *last++ = 8;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 8, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 3;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 8, 3, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 6;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 8, 3, 6, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 9;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 9, 8, 6, 3, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 5;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 9, 8, 6, 3, 5, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 2;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 9, 8, 6, 3, 5, 2, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 15;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 8, 9, 3, 5, 2, 6, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 1;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 8, 9, 3, 5, 2, 6, 1, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 4;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 8, 9, 4, 5, 2, 6, 1, 3, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 12;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 9, 4, 8, 2, 6, 1, 3, 5, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 7;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 9, 4, 8, 2, 6, 1, 3, 5, 7, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 10;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 10, 4, 8, 9, 6, 1, 3, 5, 7, 2, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 13;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 13, 4, 8, 10, 6, 1, 3, 5, 7, 2, 9, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 11;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 13, 4, 8, 10, 11, 1, 3, 5, 7, 2, 9, 6, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 14;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 14, 4, 8, 10, 13, 1, 3, 5, 7, 2, 9, 6, 11 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}